

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ReleasePages(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *this,void *address,uint pageCount,void *segmentParam)

{
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_00;
  size_t *psVar1;
  HANDLE pVVar2;
  PageMemoryData *pPVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  HANDLE pVVar8;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar9;
  ulong uVar10;
  size_t *psVar11;
  ulong uVar12;
  
  if (this->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x635,"(pageCount <= this->maxAllocPageCount)",
                       "pageCount <= this->maxAllocPageCount");
    if (!bVar5) goto LAB_0070771d;
    *puVar7 = 0;
  }
  bVar5 = ValidThreadAccess(this);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x637,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar5) goto LAB_0070771d;
    *puVar7 = 0;
  }
  iVar6 = (*this->_vptr_PageAllocatorBase[3])(this);
  if ((char)iVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x638,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar5) goto LAB_0070771d;
    *puVar7 = 0;
  }
  if (this->disablePageReuse == true) {
    pVVar2 = this->processHandle;
    pVVar8 = GetCurrentProcess();
    if (pVVar2 != pVVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x63d,"(this->processHandle == GetCurrentProcess())",
                         "this->processHandle == GetCurrentProcess()");
      if (!bVar5) goto LAB_0070771d;
      *puVar7 = 0;
    }
    VirtualFree(address,(ulong)(pageCount << 0xc),0x4000);
    return;
  }
  PageTracking::ReportFree((PageAllocator *)this,address,(ulong)(pageCount << 0xc));
  fromSegmentList =
       GetSegmentList(this,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  if (fromSegmentList ==
      (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x647,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
    if (!bVar5) goto LAB_0070771d;
    *puVar7 = 0;
  }
  psVar11 = &this->freePageCount;
  uVar12 = (ulong)pageCount;
  if ((ulong)this->maxFreePageCount < this->freePageCount + uVar12) {
    if ((this->zeroPages != false) ||
       (this_00 = &this->emptySegments,
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
       (this->emptySegments).
       super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.
       base == this_00)) {
      PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
                ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam,address,
                 pageCount);
      uVar10 = uVar12 * 0x1000;
      SubUsedBytes(this,uVar10);
      pPVar3 = this->memoryData;
      if (pPVar3 == (PageMemoryData *)0x0) {
        psVar11 = &this->committedBytes;
      }
      else {
        pPVar3->releasePageCount = pPVar3->releasePageCount + uVar12;
        this->committedBytes = this->committedBytes + uVar12 * -0x1000;
        pPVar3->decommitPageCount = pPVar3->decommitPageCount + uVar12;
        psVar11 = &pPVar3->currentCommittedPageCount;
        uVar10 = uVar12;
      }
      *psVar11 = *psVar11 - uVar10;
      psVar11 = &this->decommitPageCount;
      goto LAB_00707700;
    }
    pPVar9 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Head(this_00);
    if (pPVar9->decommitPageCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x65f,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                         "emptySegments.Head().GetDecommitPageCount() == 0");
      if (!bVar5) {
LAB_0070771d:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    pPVar9 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Head(this_00);
    LogFreeSegment(this,&pPVar9->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
    DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    RemoveHead<Memory::NoThrowHeapAllocator>
              (this_00,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
    uVar10 = this->freePageCount - (ulong)this->maxAllocPageCount;
    this->freePageCount = uVar10;
    if (uVar10 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar10;
    }
  }
  else if ((DAT_015d6420 == '\x01') && (this->queueZeroPages == true)) {
    bVar5 = HasZeroPageQueue(this);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x67e,"(HasZeroPageQueue())","HasZeroPageQueue()");
      if (!bVar5) goto LAB_0070771d;
      *puVar7 = 0;
    }
    AddPageToZeroQueue(this,address,pageCount,
                       (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    return;
  }
  memset(address,0xfe,(ulong)(pageCount << 0xc));
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages
            ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam,address,
             pageCount);
  SubUsedBytes(this,uVar12 << 0xc);
  if (this->memoryData != (PageMemoryData *)0x0) {
    psVar1 = &this->memoryData->releasePageCount;
    *psVar1 = *psVar1 + uVar12;
  }
  UpdateMinFreePageCount(this);
LAB_00707700:
  *psVar11 = *psVar11 + uVar12;
  TransferSegment(this,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam,
                  fromSegmentList);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ReleasePages(__in void * address, uint pageCount, __in void * segmentParam)
{
    Assert(pageCount <= this->maxAllocPageCount);
    TPageSegment * segment = (TPageSegment*) segmentParam;
    ASSERT_THREAD();
    Assert(!this->HasMultiThreadAccess());

#ifdef RECYCLER_NO_PAGE_REUSE
    if (disablePageReuse)
    {
        Assert(this->processHandle == GetCurrentProcess());
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        VirtualFree(address, pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        return;
    }
#endif

    PageTracking::ReportFree((PageAllocator*)this, address, AutoSystemInfo::PageSize * pageCount);

    DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
    Assert(fromSegmentList != nullptr);

    /**
     * The logic here is as follows:
     * - If we have sufficient pages already, such that the newly free pages are going
     *   to cause us to exceed the threshold of free pages we want:
     *     - First check and see if we have empty segments. If we do, just release that
     *       entire segment back to the operating system, and add the current segments
     *       free pages to our free page pool
     *     - Otherwise, if there are no empty segments (i.e our memory is fragmented),
     *       decommit the pages that are being released so that they don't count towards
     *       our working set
     * - If we don't have enough pages:
     *    - If we're in the free page queuing mode where we have a "pages to zero out" queue
     *      put it in that queue and we're done
     *    - Otherwise, zero it out, and add it to the free page pool
     *  Now that we've either decommitted or freed the pages in the segment,
     *  move the segment to the right segment list
     */
    if (this->freePageCount + pageCount > maxFreePageCount)
    {
        // Release a whole segment if possible to reduce the number of VirtualFree and fragmentation
        if (!ZeroPages() && !emptySegments.Empty())
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
            this->freePageCount -= maxAllocPageCount;

#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
            MemSetLocal(address, DbgMemFill, AutoSystemInfo::PageSize * pageCount);
#endif
            segment->ReleasePages(address, pageCount);
            LogFreePages(pageCount);
            this->AddFreePageCount(pageCount);

        }
        else
        {
            segment->template DecommitPages<false>(address, pageCount);
            LogFreePages(pageCount);
            LogDecommitPages(pageCount);
#if DBG_DUMP
            this->decommitPageCount += pageCount;
#endif
        }
    }
    else
    {
#if ENABLE_BACKGROUND_PAGE_ZEROING
        if (CONFIG_FLAG(EnableBGFreeZero))
        {
            if (QueueZeroPages())
            {
                Assert(HasZeroPageQueue());
                AddPageToZeroQueue(address, pageCount, segment);
                return;
            }
        }
#endif

        this->FillFreePages((char *)address, pageCount);
        segment->ReleasePages(address, pageCount);
        LogFreePages(pageCount);
        this->AddFreePageCount(pageCount);
    }

    TransferSegment(segment, fromSegmentList);
}